

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree::next_selected_item(Fl_Tree *this,Fl_Tree_Item *item,int dir)

{
  char cVar1;
  Fl_Tree_Item *pFStack_20;
  int dir_local;
  Fl_Tree_Item *item_local;
  Fl_Tree *this_local;
  
  pFStack_20 = item;
  if (dir != 0xff52) {
    if (dir != 0xff54) {
      return (Fl_Tree_Item *)0x0;
    }
    if (item == (Fl_Tree_Item *)0x0) {
      pFStack_20 = first(this);
      if (pFStack_20 == (Fl_Tree_Item *)0x0) {
        return (Fl_Tree_Item *)0x0;
      }
      cVar1 = Fl_Tree_Item::is_selected(pFStack_20);
      if (cVar1 != '\0') {
        return pFStack_20;
      }
    }
    do {
      pFStack_20 = Fl_Tree_Item::next(pFStack_20);
      if (pFStack_20 == (Fl_Tree_Item *)0x0) {
        return (Fl_Tree_Item *)0x0;
      }
      cVar1 = Fl_Tree_Item::is_selected(pFStack_20);
    } while (cVar1 == '\0');
    return pFStack_20;
  }
  if (item == (Fl_Tree_Item *)0x0) {
    pFStack_20 = last(this);
    if (pFStack_20 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    cVar1 = Fl_Tree_Item::is_selected(pFStack_20);
    if (cVar1 != '\0') {
      return pFStack_20;
    }
  }
  do {
    pFStack_20 = Fl_Tree_Item::prev(pFStack_20);
    if (pFStack_20 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    cVar1 = Fl_Tree_Item::is_selected(pFStack_20);
  } while (cVar1 == '\0');
  return pFStack_20;
}

Assistant:

Fl_Tree_Item *Fl_Tree::next_selected_item(Fl_Tree_Item *item, int dir) {
  switch (dir) {
    case FL_Down:
      if ( ! item ) {
	if ( ! (item = first()) ) return(0);
	if ( item->is_selected() ) return(item);
      }
      while ( (item = item->next()) )
	if ( item->is_selected() )
	  return(item);
      return(0);
    case FL_Up:
      if ( ! item ) {
	if ( ! (item = last()) ) return(0);
	if ( item->is_selected() ) return(item);
      }
      while ( (item = item->prev()) )
	if ( item->is_selected() )
	  return(item);
      return(0);
  }
  return(0);
}